

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranLexer.cxx
# Opt level: O1

void yyunput(int c,char *yy_bp,yyscan_t yyscanner)

{
  undefined1 *puVar1;
  undefined4 uVar2;
  long lVar3;
  ulong uVar4;
  undefined1 *puVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  puVar5 = *(undefined1 **)((long)yyscanner + 0x40);
  *puVar5 = *(undefined1 *)((long)yyscanner + 0x30);
  lVar7 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  lVar3 = *(long *)(lVar7 + 8);
  if (puVar5 < (undefined1 *)(lVar3 + 2U)) {
    lVar7 = *(int *)(lVar7 + 0x18) + lVar3 + 2;
    uVar8 = lVar3 + *(int *)((long)yyscanner + 0x34) + 2;
    while( true ) {
      lVar3 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
      uVar4 = *(ulong *)(lVar3 + 8);
      if (uVar8 <= uVar4) break;
      puVar1 = (undefined1 *)(uVar8 - 1);
      uVar8 = uVar8 - 1;
      *(undefined1 *)(lVar7 + -1) = *puVar1;
      lVar7 = lVar7 + -1;
    }
    iVar6 = (int)lVar7 - (int)uVar8;
    puVar5 = puVar5 + iVar6;
    uVar2 = *(undefined4 *)(lVar3 + 0x18);
    *(undefined4 *)((long)yyscanner + 0x34) = uVar2;
    *(undefined4 *)(lVar3 + 0x1c) = uVar2;
    if (puVar5 < (undefined1 *)(uVar4 + 2)) {
      yy_fatal_error("flex scanner push-back overflow",yy_bp);
    }
    yy_bp = yy_bp + iVar6;
  }
  puVar5[-1] = (char)c;
  *(char **)((long)yyscanner + 0x80) = yy_bp;
  *(undefined1 *)((long)yyscanner + 0x30) = puVar5[-1];
  *(undefined1 **)((long)yyscanner + 0x40) = puVar5 + -1;
  return;
}

Assistant:

static void yyunput (int c, char * yy_bp , yyscan_t yyscanner)
{
	char *yy_cp;
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

    yy_cp = yyg->yy_c_buf_p;

	/* undo effects of setting up yytext */
	*yy_cp = yyg->yy_hold_char;

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = yyg->yy_n_chars + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			yyg->yy_n_chars = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

	yyg->yytext_ptr = yy_bp;
	yyg->yy_hold_char = *yy_cp;
	yyg->yy_c_buf_p = yy_cp;
}